

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O2

void handle_result(uv_fs_t *req)

{
  uint64_t uVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_fs_t stat_req;
  
  stat_req.data = (void *)(long)req->fs_type;
  eval_b = 0x1e;
  if (stat_req.data == (void *)0x1e) {
    stat_req.data = (void *)req->result;
    eval_b = 0;
    if (stat_req.data == (void *)0x0) {
      iVar2 = uv_fs_stat(0,&stat_req,req->path,0);
      eval_b = stat_req.statbuf.st_size;
      uVar1 = stat_req.statbuf.st_mode;
      pvVar3 = (void *)(long)iVar2;
      eval_b_2 = 0;
      if (pvVar3 == (void *)0x0) {
        uv_fs_req_cleanup(&stat_req);
        iVar2 = uv_fs_stat(0,&stat_req,"test_file_dst",0);
        pvVar3 = (void *)(long)iVar2;
        eval_b_2 = 0;
        if (pvVar3 == (void *)0x0) {
          if (stat_req.statbuf.st_size == eval_b) {
            if (stat_req.statbuf.st_mode == uVar1) {
              uv_fs_req_cleanup(&stat_req);
              uv_fs_req_cleanup(req);
              result_check_count = result_check_count + 1;
              return;
            }
            pcVar5 = "mode";
            pcVar4 = "stat_req.statbuf.st_mode";
            uVar6 = 0x41;
            pvVar3 = (void *)stat_req.statbuf.st_mode;
            eval_b = uVar1;
          }
          else {
            pcVar5 = "size";
            pcVar4 = "stat_req.statbuf.st_size";
            uVar6 = 0x40;
            pvVar3 = (void *)stat_req.statbuf.st_size;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "r";
          uVar6 = 0x3f;
          eval_b = eval_b_2;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "r";
        uVar6 = 0x3a;
        eval_b = eval_b_2;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "req->result";
      uVar6 = 0x36;
      pvVar3 = stat_req.data;
    }
  }
  else {
    pcVar5 = "UV_FS_COPYFILE";
    pcVar4 = "req->fs_type";
    uVar6 = 0x35;
    pvVar3 = stat_req.data;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
          ,uVar6,pcVar4,"==",pcVar5,pvVar3,"==",eval_b);
  abort();
}

Assistant:

static void handle_result(uv_fs_t* req) {
  uv_fs_t stat_req;
  uint64_t size;
  uint64_t mode;
  int r;

  ASSERT_EQ(req->fs_type, UV_FS_COPYFILE);
  ASSERT_OK(req->result);

  /* Verify that the file size and mode are the same. */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT_OK(r);
  size = stat_req.statbuf.st_size;
  mode = stat_req.statbuf.st_mode;
  uv_fs_req_cleanup(&stat_req);
  r = uv_fs_stat(NULL, &stat_req, dst, NULL);
  ASSERT_OK(r);
  ASSERT_EQ(stat_req.statbuf.st_size, size);
  ASSERT_EQ(stat_req.statbuf.st_mode, mode);
  uv_fs_req_cleanup(&stat_req);
  uv_fs_req_cleanup(req);
  result_check_count++;
}